

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matdurbn.c
# Opt level: O3

MATRIX mat_durbin(MATRIX R)

{
  MATRIX ppdVar1;
  int iVar2;
  double *pdVar3;
  MATRIX A;
  MATRIX A_00;
  MATRIX A_01;
  MATRIX A_02;
  double *pdVar4;
  MATRIX ppdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int row;
  uint row_00;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  iVar2 = *(int *)(R + -1);
  row_00 = iVar2 - 1;
  row = iVar2 + 1;
  A = mat_creat(row,1,-1);
  A_00 = mat_creat(row,1,-1);
  A_01 = mat_creat(row,1,-1);
  A_02 = mat_creat(row,row,-1);
  **A = *R[1];
  pdVar4 = *A_00;
  *pdVar4 = **R;
  if ((long)iVar2 < 2) {
    ppdVar5 = mat_creat(row_00,1,-1);
  }
  else {
    uVar11 = (ulong)row_00;
    uVar6 = 1;
    lVar7 = 8;
    lVar8 = 0;
    do {
      dVar12 = *A[uVar6 - 1] / *pdVar4;
      pdVar3 = A_01[uVar6];
      *pdVar3 = dVar12;
      dVar13 = *pdVar4;
      pdVar4 = A_00[uVar6];
      *pdVar4 = (1.0 - dVar12 * dVar12) * dVar13;
      A_02[uVar6][uVar6] = -*pdVar3;
      if (1 < uVar6) {
        lVar9 = 8;
        lVar10 = lVar8;
        do {
          *(double *)(*(long *)((long)A_02 + lVar9) + uVar6 * 8) =
               *(double *)(*(long *)((long)A_02 + lVar9) + -8 + uVar6 * 8) -
               *pdVar3 * *(double *)(*(long *)((long)A_02 + lVar10) + -8 + uVar6 * 8);
          lVar9 = lVar9 + 8;
          lVar10 = lVar10 + -8;
        } while (lVar10 != 0);
      }
      if (uVar6 != uVar11) {
        dVar13 = *R[uVar6 + 1];
        pdVar3 = A[uVar6];
        *pdVar3 = dVar13;
        lVar10 = lVar7;
        ppdVar5 = A_02;
        do {
          ppdVar5 = ppdVar5 + 1;
          dVar13 = dVar13 + (*ppdVar5)[uVar6] * **(double **)((long)R + lVar10);
          *pdVar3 = dVar13;
          lVar10 = lVar10 + -8;
        } while (lVar10 != 0);
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 8;
      lVar7 = lVar7 + 8;
    } while (uVar6 != (long)iVar2);
    ppdVar5 = mat_creat(row_00,1,-1);
    if (1 < iVar2) {
      uVar6 = 0;
      do {
        lVar7 = uVar6 + 1;
        ppdVar1 = ppdVar5 + uVar6;
        uVar6 = uVar6 + 1;
        **ppdVar1 = -A_02[lVar7][uVar11];
      } while (uVar11 != uVar6);
    }
  }
  mat_free(A_02);
  mat_free(A);
  mat_free(A_01);
  mat_free(A_00);
  return ppdVar5;
}

Assistant:

MATRIX mat_durbin( MATRIX R )
{
	int	i, i1, j, ji, p;
	MATRIX	W, E, K, A, X;

	p = MatRow(R) - 1;
	W = mat_creat( p+2, 1, UNDEFINED );
	E = mat_creat( p+2, 1, UNDEFINED );
	K = mat_creat( p+2, 1, UNDEFINED );
	A = mat_creat( p+2, p+2, UNDEFINED );

	W[0][0] = R[1][0];
	E[0][0] = R[0][0];

	for (i=1; i<=p; i++)
		{
		K[i][0] = W[i-1][0] / E[i-1][0];
		E[i][0] = E[i-1][0] * (1.0 - K[i][0] * K[i][0]);

		A[i][i] = -K[i][0];

		i1 = i-1;
		if (i1 >= 1)
			{
			for (j=1; j<=i1; j++)
				{
				ji = i - j;
				A[j][i] = A[j][i1] - K[i][0] * A[ji][i1];
				}
			}

		if (i != p)
			{
			W[i][0] = R[i+1][0];
			for (j=1; j<=i; j++)
				W[i][0] += A[j][i] * R[i-j+1][0];
			}
		}

	X = mat_creat( p, 1, UNDEFINED );
	for (i=0; i<p; i++)
		{
		X[i][0] = -A[i+1][p];
		}

	mat_free( A );
	mat_free( W );
	mat_free( K );
	mat_free( E );
	return (X);
}